

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  ushort uVar3;
  AliasRet AVar4;
  TRef TVar5;
  ulong uVar6;
  IRIns *pIVar7;
  IRIns *refa;
  IRRef1 *pIVar8;
  IRIns *pIVar9;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar3 = J->chain[0x4d];
  if (uVar1 < uVar3) {
    IVar2 = (J->fold).ins.field_0.op2;
    pIVar7 = (J->cur).ir;
    refa = pIVar7 + uVar1;
    pIVar8 = J->chain + 0x4d;
    do {
      pIVar9 = pIVar7 + uVar3;
      AVar4 = aa_fref(J,refa,pIVar7 + (pIVar9->field_0).op1);
      if (AVar4 == ALIAS_MAY) {
        if ((pIVar9->field_0).op2 != IVar2) break;
      }
      else if (AVar4 == ALIAS_MUST) {
        if (((pIVar9->field_0).op2 == IVar2) && (5 < (ushort)((refa->field_0).op2 - 0x10))) {
          return 4;
        }
        if (J->chain[0x11] < uVar3) {
          uVar6 = (ulong)((J->cur).nins - 1);
          if (uVar6 <= uVar3) goto LAB_00157584;
          pIVar7 = pIVar7 + uVar6;
          goto LAB_00157565;
        }
        break;
      }
      uVar3 = (pIVar9->field_0).prev;
      pIVar8 = &(pIVar9->field_0).prev;
    } while (uVar1 < uVar3);
  }
  goto LAB_0015750d;
  while (pIVar7 = pIVar7 + -1, pIVar9 < pIVar7) {
LAB_00157565:
    if (((char)(pIVar7->field_1).t.irt < '\0') ||
       (((pIVar7->field_1).o == 'E' && ((pIVar7->field_0).op2 == (refa->field_0).op2))))
    goto LAB_0015750d;
  }
LAB_00157584:
  *pIVar8 = (pIVar9->field_0).prev;
  *pIVar9 = (IRIns)0xc0000000000;
LAB_0015750d:
  TVar5 = lj_ir_emit(J);
  return TVar5;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val &&
	  !(xr->op2 >= IRFL_SBUF_W && xr->op2 <= IRFL_SBUF_R))
	return DROPFOLD;  /* Same value: drop the new store. */
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}